

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFontAtlas *pIVar3;
  ImFont *this;
  ImFontConfig *pIVar4;
  float fVar5;
  ImVec2 pos;
  bool bVar6;
  bool bVar7;
  ImU32 IVar8;
  ImGuiStyle *v;
  char *pcVar9;
  size_t sVar10;
  ImGuiIO *pIVar11;
  value_type *ppIVar12;
  ImFontGlyph *pIVar13;
  ImDrawList *this_00;
  int i;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ImVec4 *pIVar18;
  ImWchar c;
  uint uVar19;
  ImVec4 *pIVar20;
  int n;
  int iVar21;
  ImGuiStyle *__dest;
  int i_1;
  void *ptr_id;
  float fVar22;
  float fVar23;
  ImVec2 IVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool window_border;
  undefined7 uStack_c7;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float *local_b8;
  float local_b0;
  uint local_ac;
  ImVec2 cell_p2;
  float local_78;
  float fStack_74;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  v = GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar21 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar21 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar22 = GetWindowWidth();
  PushItemWidth(fVar22 * 0.5);
  bVar6 = ShowStyleSelector("Colors##Selector");
  if (bVar6) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
  }
  ShowFontSelector("Fonts##Selector");
  local_b8 = &v->FrameRounding;
  bVar6 = SliderFloat("FrameRounding",local_b8,0.0,12.0,"%.0f",1.0);
  if (bVar6) {
    v->GrabRounding = v->FrameRounding;
  }
  window_border = 0.0 < v->WindowBorderSize;
  bVar6 = Checkbox("WindowBorder",&window_border);
  if (bVar6) {
    if (window_border == false) {
      fVar22 = 0.0;
    }
    else {
      fVar22 = 1.0;
    }
    v->WindowBorderSize = fVar22;
  }
  SameLine(0.0,-1.0);
  window_border = 0.0 < v->FrameBorderSize;
  bVar6 = Checkbox("FrameBorder",&window_border);
  if (bVar6) {
    if (window_border == false) {
      fVar22 = 0.0;
    }
    else {
      fVar22 = 1.0;
    }
    v->FrameBorderSize = fVar22;
  }
  SameLine(0.0,-1.0);
  window_border = 0.0 < v->PopupBorderSize;
  bVar6 = Checkbox("PopupBorder",&window_border);
  if (bVar6) {
    fVar22 = 1.0;
    if (window_border == false) {
      fVar22 = 0.0;
    }
    v->PopupBorderSize = fVar22;
  }
  _window_border = 0.0;
  fStack_c4 = 0.0;
  bVar6 = Button("Save Ref",(ImVec2 *)&window_border);
  if (bVar6) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x338);
    memmove(__dest,v,0x338);
  }
  SameLine(0.0,-1.0);
  _window_border = 0.0;
  fStack_c4 = 0.0;
  bVar6 = Button("Revert Ref",(ImVec2 *)&window_border);
  if (bVar6) {
    memcpy(v,__dest,0x338);
  }
  SameLine(0.0,-1.0);
  ShowHelpMarker(
                "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export Colors\" below to save them somewhere."
                );
  bVar6 = TreeNode("Rendering");
  if (bVar6) {
    Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
    SameLine(0.0,-1.0);
    ShowHelpMarker(
                  "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                  );
    Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
    PushItemWidth(100.0);
    DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,3.4028235e+38,
              (char *)0x0,2.0);
    if (v->CurveTessellationTol <= 0.0 && v->CurveTessellationTol != 0.0) {
      v->CurveTessellationTol = 0.1;
    }
    DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",1.0);
    PopItemWidth();
    TreePop();
  }
  bVar6 = TreeNode("Settings");
  if (bVar6) {
    SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",1.0);
    SliderFloat("PopupRounding",&v->PopupRounding,0.0,16.0,"%.0f",1.0);
    SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",1.0);
    SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",1.0);
    SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",1.0);
    SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",1.0);
    SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",1.0);
    Text("BorderSize");
    SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",1.0);
    SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",1.0);
    Text("Rounding");
    SliderFloat("WindowRounding",&v->WindowRounding,0.0,14.0,"%.0f",1.0);
    SliderFloat("ChildRounding",&v->ChildRounding,0.0,16.0,"%.0f",1.0);
    SliderFloat("FrameRounding",local_b8,0.0,12.0,"%.0f",1.0);
    SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",1.0);
    SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",1.0);
    Text("Alignment");
    SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",1.0);
    SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",1.0);
    SameLine(0.0,-1.0);
    ShowHelpMarker("Alignment applies when a button is larger than its text content.");
    Text("Safe Area Padding");
    SameLine(0.0,-1.0);
    ShowHelpMarker(
                  "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                  );
    SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",1.0);
    TreePop();
  }
  bVar6 = TreeNode("Colors");
  if (bVar6) {
    _window_border = 0.0;
    fStack_c4 = 0.0;
    bVar6 = Button("Export Unsaved",(ImVec2 *)&window_border);
    if (bVar6) {
      if (ShowStyleEditor::output_dest == 0) {
        LogToClipboard(-1);
      }
      else {
        LogToTTY(-1);
      }
      LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
      pIVar20 = v->Colors;
      pIVar18 = __dest->Colors;
      for (lVar16 = 0; lVar16 != 0x2a; lVar16 = lVar16 + 1) {
        pcVar9 = GetStyleColorName((ImGuiCol)lVar16);
        if (ShowStyleEditor::output_only_modified == true) {
          auVar25[0] = -(*(char *)&pIVar20->x == *(char *)&pIVar18->x);
          auVar25[1] = -(*(char *)((long)&pIVar20->x + 1) == *(char *)((long)&pIVar18->x + 1));
          auVar25[2] = -(*(char *)((long)&pIVar20->x + 2) == *(char *)((long)&pIVar18->x + 2));
          auVar25[3] = -(*(char *)((long)&pIVar20->x + 3) == *(char *)((long)&pIVar18->x + 3));
          auVar25[4] = -(*(char *)&pIVar20->y == *(char *)&pIVar18->y);
          auVar25[5] = -(*(char *)((long)&pIVar20->y + 1) == *(char *)((long)&pIVar18->y + 1));
          auVar25[6] = -(*(char *)((long)&pIVar20->y + 2) == *(char *)((long)&pIVar18->y + 2));
          auVar25[7] = -(*(char *)((long)&pIVar20->y + 3) == *(char *)((long)&pIVar18->y + 3));
          auVar25[8] = -(*(char *)&pIVar20->z == *(char *)&pIVar18->z);
          auVar25[9] = -(*(char *)((long)&pIVar20->z + 1) == *(char *)((long)&pIVar18->z + 1));
          auVar25[10] = -(*(char *)((long)&pIVar20->z + 2) == *(char *)((long)&pIVar18->z + 2));
          auVar25[0xb] = -(*(char *)((long)&pIVar20->z + 3) == *(char *)((long)&pIVar18->z + 3));
          auVar25[0xc] = -(*(char *)&pIVar20->w == *(char *)&pIVar18->w);
          auVar25[0xd] = -(*(char *)((long)&pIVar20->w + 1) == *(char *)((long)&pIVar18->w + 1));
          auVar25[0xe] = -(*(char *)((long)&pIVar20->w + 2) == *(char *)((long)&pIVar18->w + 2));
          auVar25[0xf] = -(*(char *)((long)&pIVar20->w + 3) == *(char *)((long)&pIVar18->w + 3));
          if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0017dbdb;
        }
        else {
LAB_0017dbdb:
          sVar10 = strlen(pcVar9);
          LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",(double)pIVar20->x
                  ,(double)pIVar20->y,(double)pIVar20->z,(double)pIVar20->w,pcVar9,
                  (ulong)(0x17 - (int)sVar10),"");
        }
        pIVar18 = pIVar18 + 1;
        pIVar20 = pIVar20 + 1;
      }
      LogFinish();
    }
    SameLine(0.0,-1.0);
    PushItemWidth(120.0);
    Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
    PopItemWidth();
    SameLine(0.0,-1.0);
    Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
    Text(
        "Tip: Left-click on colored square to open color picker,\nRight-click to open edit options menu."
        );
    if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
      iVar21 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
      if (iVar21 != 0) {
        ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
        __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
      }
    }
    ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",200.0);
    RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
    SameLine(0.0,-1.0);
    RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x400);
    SameLine(0.0,-1.0);
    RadioButton("Both",&ShowStyleEditor::alpha_flags,0x800);
    _window_border = 0.0;
    fStack_c4 = 300.0;
    BeginChild("#colors",(ImVec2 *)&window_border,true,0x80c000);
    PushItemWidth(-160.0);
    pIVar20 = v->Colors;
    pIVar18 = __dest->Colors;
    for (lVar16 = 0; lVar16 != 0x2a; lVar16 = lVar16 + 1) {
      pcVar9 = GetStyleColorName((ImGuiCol)lVar16);
      bVar6 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar9,(char *)0x0);
      if (bVar6) {
        PushID((ImGuiCol)lVar16);
        ColorEdit4("##color",&pIVar20->x,ShowStyleEditor::alpha_flags | 0x200);
        auVar26[0] = -(*(char *)&pIVar20->x == *(char *)&pIVar18->x);
        auVar26[1] = -(*(char *)((long)&pIVar20->x + 1) == *(char *)((long)&pIVar18->x + 1));
        auVar26[2] = -(*(char *)((long)&pIVar20->x + 2) == *(char *)((long)&pIVar18->x + 2));
        auVar26[3] = -(*(char *)((long)&pIVar20->x + 3) == *(char *)((long)&pIVar18->x + 3));
        auVar26[4] = -(*(char *)&pIVar20->y == *(char *)&pIVar18->y);
        auVar26[5] = -(*(char *)((long)&pIVar20->y + 1) == *(char *)((long)&pIVar18->y + 1));
        auVar26[6] = -(*(char *)((long)&pIVar20->y + 2) == *(char *)((long)&pIVar18->y + 2));
        auVar26[7] = -(*(char *)((long)&pIVar20->y + 3) == *(char *)((long)&pIVar18->y + 3));
        auVar26[8] = -(*(char *)&pIVar20->z == *(char *)&pIVar18->z);
        auVar26[9] = -(*(char *)((long)&pIVar20->z + 1) == *(char *)((long)&pIVar18->z + 1));
        auVar26[10] = -(*(char *)((long)&pIVar20->z + 2) == *(char *)((long)&pIVar18->z + 2));
        auVar26[0xb] = -(*(char *)((long)&pIVar20->z + 3) == *(char *)((long)&pIVar18->z + 3));
        auVar26[0xc] = -(*(char *)&pIVar20->w == *(char *)&pIVar18->w);
        auVar26[0xd] = -(*(char *)((long)&pIVar20->w + 1) == *(char *)((long)&pIVar18->w + 1));
        auVar26[0xe] = -(*(char *)((long)&pIVar20->w + 2) == *(char *)((long)&pIVar18->w + 2));
        auVar26[0xf] = -(*(char *)((long)&pIVar20->w + 3) == *(char *)((long)&pIVar18->w + 3));
        if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar26[0xf] >> 7) << 0xf) != 0xffff) {
          SameLine(0.0,(v->ItemInnerSpacing).x);
          _window_border = 0.0;
          fStack_c4 = 0.0;
          bVar6 = Button("Save",(ImVec2 *)&window_border);
          if (bVar6) {
            fVar22 = pIVar20->y;
            fVar23 = pIVar20->z;
            fVar5 = pIVar20->w;
            pIVar18->x = pIVar20->x;
            pIVar18->y = fVar22;
            pIVar18->z = fVar23;
            pIVar18->w = fVar5;
          }
          SameLine(0.0,(v->ItemInnerSpacing).x);
          _window_border = 0.0;
          fStack_c4 = 0.0;
          bVar6 = Button("Revert",(ImVec2 *)&window_border);
          if (bVar6) {
            fVar22 = pIVar18->y;
            fVar23 = pIVar18->z;
            fVar5 = pIVar18->w;
            pIVar20->x = pIVar18->x;
            pIVar20->y = fVar22;
            pIVar20->z = fVar23;
            pIVar20->w = fVar5;
          }
        }
        SameLine(0.0,(v->ItemInnerSpacing).x);
        TextUnformatted(pcVar9,(char *)0x0);
        PopID();
      }
      pIVar18 = pIVar18 + 1;
      pIVar20 = pIVar20 + 1;
    }
    PopItemWidth();
    EndChild();
    TreePop();
  }
  pIVar11 = GetIO();
  bVar6 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(pIVar11->Fonts->Fonts).Size);
  if (bVar6) {
    pIVar11 = GetIO();
    pIVar3 = pIVar11->Fonts;
    bVar6 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)pIVar3->TexWidth,
                     (ulong)(uint)pIVar3->TexHeight);
    if (bVar6) {
      uVar1 = pIVar3->TexWidth;
      uVar2 = pIVar3->TexHeight;
      local_38.x = (float)(int)uVar1;
      local_38.y = (float)(int)uVar2;
      local_40.x = 0.0;
      local_40.y = 0.0;
      local_48.x = 1.0;
      local_48.y = 1.0;
      _window_border = 1.0;
      fStack_c4 = 1.0;
      fStack_c0 = 1.0;
      fStack_bc = 1.0;
      cell_p2.x = 1.0;
      cell_p2.y = 1.0;
      Image(pIVar3->TexID,&local_38,&local_40,&local_48,(ImVec4 *)&window_border,(ImVec4 *)&cell_p2)
      ;
      TreePop();
    }
    PushItemWidth(100.0);
    uVar15 = 0;
    while ((int)uVar15 < (pIVar3->Fonts).Size) {
      ppIVar12 = ImVector<ImFont_*>::operator[](&pIVar3->Fonts,uVar15);
      this = *ppIVar12;
      PushID(this);
      pcVar9 = this->ConfigData->Name;
      if (this->ConfigData == (ImFontConfig *)0x0) {
        pcVar9 = "";
      }
      local_ac = uVar15;
      bVar6 = TreeNode(this,"Font %d: \'%s\', %.2f px, %d glyphs",(double)this->FontSize,
                       (ulong)uVar15,pcVar9,(ulong)(uint)(this->Glyphs).Size);
      SameLine(0.0,-1.0);
      bVar7 = SmallButton("Set as default");
      if (bVar7) {
        pIVar11 = GetIO();
        pIVar11->FontDefault = this;
      }
      if (bVar6) {
        PushFont((ImFont *)0x17dfe5);
        Text("The quick brown fox jumps over the lazy dog");
        PopFont();
        DragFloat("Font scale",&this->Scale,0.005,0.3,2.0,"%.1f",1.0);
        InputFloat("Font offset",&(this->DisplayOffset).y,1.0,1.0,0,0);
        SameLine(0.0,-1.0);
        ShowHelpMarker(
                      "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                      );
        Text("Ascent: %f, Descent: %f, Height: %f",(double)this->Ascent,(double)this->Descent,
             (double)(this->Ascent - this->Descent));
        Text("Fallback character: \'%c\' (%d)",(ulong)this->FallbackChar);
        uVar15 = this->MetricsTotalSurface;
        fVar22 = (float)(int)uVar15;
        if (fVar22 < 0.0) {
          fVar22 = sqrtf(fVar22);
        }
        else {
          fVar22 = SQRT(fVar22);
        }
        fVar23 = (float)this->MetricsTotalSurface;
        if (fVar23 < 0.0) {
          local_b8 = (float *)CONCAT44(local_b8._4_4_,fVar22);
          fVar23 = sqrtf(fVar23);
          fVar22 = local_b8._0_4_;
        }
        else {
          fVar23 = SQRT(fVar23);
        }
        Text("Texture surface: %d pixels (approx) ~ %dx%d",(ulong)uVar15,(ulong)(uint)(int)fVar22,
             (ulong)(uint)(int)fVar23);
        lVar16 = 0x4c;
        for (uVar17 = 0; (long)uVar17 < (long)this->ConfigDataCount; uVar17 = uVar17 + 1) {
          pIVar4 = this->ConfigData;
          if (pIVar4 != (ImFontConfig *)0x0) {
            BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",uVar17 & 0xffffffff,
                       pIVar4->Name + lVar16 + -0x4c,(ulong)*(uint *)(pIVar4->Name + lVar16 + -0x80)
                       ,(ulong)*(uint *)(pIVar4->Name + lVar16 + -0x7c),
                       (ulong)(byte)pIVar4->Name[lVar16 + -0x78]);
          }
          lVar16 = lVar16 + 0x80;
        }
        bVar6 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(this->Glyphs).Size);
        if (bVar6) {
          for (ptr_id = (void *)0x0; ptr_id < (void *)0x10000;
              ptr_id = (void *)((long)ptr_id + 0x100)) {
            uVar17 = 0;
            for (iVar21 = 0; iVar14 = (int)uVar17, iVar21 != 0x100; iVar21 = iVar21 + 1) {
              pIVar13 = ImFont::FindGlyphNoFallback(this,(short)ptr_id + (short)iVar21);
              uVar17 = (ulong)((iVar14 + 1) - (uint)(pIVar13 == (ImFontGlyph *)0x0));
            }
            if (iVar14 != 0) {
              pcVar9 = "glyphs";
              if (iVar14 == 1) {
                pcVar9 = "glyph";
              }
              bVar6 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",(ulong)ptr_id & 0xffffffff,
                               (ulong)((uint)ptr_id | 0xff),uVar17,pcVar9);
              if (bVar6) {
                local_b8 = (float *)CONCAT44(local_b8._4_4_,this->FontSize);
                local_b0 = (v->ItemSpacing).y + this->FontSize;
                IVar24 = GetCursorScreenPos();
                this_00 = GetWindowDrawList();
                fStack_74 = IVar24.y;
                uVar17 = 0;
                while (uVar15 = (uint)uVar17, uVar15 != 0x100) {
                  local_78 = IVar24.x;
                  _window_border = (float)(uVar15 & 0xf) * local_b0 + local_78;
                  fStack_c4 = (float)(int)(uVar17 >> 4) * local_b0 + fStack_74;
                  cell_p2.y = fStack_c4 + local_b8._0_4_;
                  cell_p2.x = _window_border + local_b8._0_4_;
                  uVar19 = (uint)ptr_id + uVar15;
                  c = (ImWchar)uVar19;
                  pIVar13 = ImFont::FindGlyphNoFallback(this,c);
                  IVar8 = 0x64ffffff;
                  if (pIVar13 == (ImFontGlyph *)0x0) {
                    IVar8 = 0x32ffffff;
                  }
                  ImDrawList::AddRect(this_00,(ImVec2 *)&window_border,&cell_p2,IVar8,0.0,0xf,1.0);
                  pos = _window_border;
                  IVar8 = GetColorU32(0,1.0);
                  ImFont::RenderChar(this,this_00,local_b8._0_4_,pos,IVar8,c);
                  if (pIVar13 != (ImFontGlyph *)0x0) {
                    bVar6 = IsMouseHoveringRect((ImVec2 *)&window_border,&cell_p2,true);
                    if (bVar6) {
                      BeginTooltip();
                      Text("Codepoint: U+%04X",(ulong)uVar19);
                      Separator();
                      Text("AdvanceX: %.1f",(double)pIVar13->AdvanceX);
                      Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar13->X0,(double)pIVar13->Y0,
                           (double)pIVar13->X1,(double)pIVar13->Y1);
                      Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar13->U0,(double)pIVar13->V0,
                           (double)pIVar13->U1,(double)pIVar13->V1);
                      EndTooltip();
                    }
                  }
                  uVar17 = (ulong)(uVar15 + 1);
                }
                fStack_c4 = local_b0 * 16.0;
                _window_border = local_b0 * 16.0;
                Dummy((ImVec2 *)&window_border);
                TreePop();
              }
            }
          }
          TreePop();
        }
        TreePop();
      }
      PopID();
      uVar15 = local_ac + 1;
    }
    DragFloat("this window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.1f",1.0);
    pIVar11 = GetIO();
    DragFloat("global scale",&pIVar11->FontGlobalScale,0.005,0.3,2.0,"%.1f",1.0);
    PopItemWidth();
    SetWindowFontScale(ShowStyleEditor::window_scale);
    TreePop();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f")) 
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    ShowHelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export Colors\" below to save them somewhere.");

    if (ImGui::TreeNode("Rendering"))
    {
        ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); ShowHelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
        ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
        ImGui::PushItemWidth(100);
        ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, NULL, 2.0f);
        if (style.CurveTessellationTol < 0.0f) style.CurveTessellationTol = 0.10f;
        ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
        ImGui::PopItemWidth();
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Settings"))
    {
        ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 16.0f, "%.0f");
        ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
        ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
        ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
        ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
        ImGui::Text("BorderSize");
        ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::Text("Rounding");
        ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 14.0f, "%.0f");
        ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 16.0f, "%.0f");
        ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
        ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
        ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
        ImGui::Text("Alignment");
        ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
        ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); ShowHelpMarker("Alignment applies when a button is larger than its text content.");
        ImGui::Text("Safe Area Padding"); ImGui::SameLine(); ShowHelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
        ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Colors"))
    {
        static int output_dest = 0;
        static bool output_only_modified = true;
        if (ImGui::Button("Export Unsaved"))
        {
            if (output_dest == 0)
                ImGui::LogToClipboard();
            else
                ImGui::LogToTTY();
            ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const ImVec4& col = style.Colors[i];
                const char* name = ImGui::GetStyleColorName(i);
                if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                    ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23-(int)strlen(name), "", col.x, col.y, col.z, col.w);
            }
            ImGui::LogFinish();
        }
        ImGui::SameLine(); ImGui::PushItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0"); ImGui::PopItemWidth();
        ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

        ImGui::Text("Tip: Left-click on colored square to open color picker,\nRight-click to open edit options menu.");

        static ImGuiTextFilter filter;
        filter.Draw("Filter colors", 200);

        static ImGuiColorEditFlags alpha_flags = 0;
        ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine(); 
        ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine(); 
        ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf);

        ImGui::BeginChild("#colors", ImVec2(0, 300), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
        ImGui::PushItemWidth(-160);
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName(i);
            if (!filter.PassFilter(name))
                continue;
            ImGui::PushID(i);
            ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
            if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
            {
                // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                // Read the FAQ and misc/fonts/README.txt about using icon fonts. It's really easy and super convenient!
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
            }
            ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
            ImGui::TextUnformatted(name);
            ImGui::PopID();
        }
        ImGui::PopItemWidth();
        ImGui::EndChild();

        ImGui::TreePop();
    }

    bool fonts_opened = ImGui::TreeNode("Fonts", "Fonts (%d)", ImGui::GetIO().Fonts->Fonts.Size);
    if (fonts_opened)
    {
        ImFontAtlas* atlas = ImGui::GetIO().Fonts;
        if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
        {
            ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0,0), ImVec2(1,1), ImColor(255,255,255,255), ImColor(255,255,255,128));
            ImGui::TreePop();
        }
        ImGui::PushItemWidth(100);
        for (int i = 0; i < atlas->Fonts.Size; i++)
        {
            ImFont* font = atlas->Fonts[i];
            ImGui::PushID(font);
            bool font_details_opened = ImGui::TreeNode(font, "Font %d: \'%s\', %.2f px, %d glyphs", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size);
            ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) ImGui::GetIO().FontDefault = font;
            if (font_details_opened)
            {
                ImGui::PushFont(font);
                ImGui::Text("The quick brown fox jumps over the lazy dog");
                ImGui::PopFont();
                ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                ImGui::InputFloat("Font offset", &font->DisplayOffset.y, 1, 1, 0);
                ImGui::SameLine(); ShowHelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                ImGui::Text("Fallback character: '%c' (%d)", font->FallbackChar, font->FallbackChar);
                ImGui::Text("Texture surface: %d pixels (approx) ~ %dx%d", font->MetricsTotalSurface, (int)sqrtf((float)font->MetricsTotalSurface), (int)sqrtf((float)font->MetricsTotalSurface));
                for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                    if (ImFontConfig* cfg = &font->ConfigData[config_i])
                        ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                {
                    // Display all glyphs of the fonts in separate pages of 256 characters
                    for (int base = 0; base < 0x10000; base += 256)
                    {
                        int count = 0;
                        for (int n = 0; n < 256; n++)
                            count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                        if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base+255, count, count > 1 ? "glyphs" : "glyph"))
                        {
                            float cell_size = font->FontSize * 1;
                            float cell_spacing = style.ItemSpacing.y;
                            ImVec2 base_pos = ImGui::GetCursorScreenPos();
                            ImDrawList* draw_list = ImGui::GetWindowDrawList();
                            for (int n = 0; n < 256; n++)
                            {
                                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base+n));
                                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255,255,255,100) : IM_COL32(255,255,255,50));
                                font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base+n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                {
                                    ImGui::BeginTooltip();
                                    ImGui::Text("Codepoint: U+%04X", base+n);
                                    ImGui::Separator();
                                    ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                    ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                    ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                    ImGui::EndTooltip();
                                }
                            }
                            ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }
            ImGui::PopID();
        }
        static float window_scale = 1.0f;
        ImGui::DragFloat("this window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.1f");              // scale only this window
        ImGui::DragFloat("global scale", &ImGui::GetIO().FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.1f"); // scale everything
        ImGui::PopItemWidth();
        ImGui::SetWindowFontScale(window_scale);
        ImGui::TreePop();
    }

    ImGui::PopItemWidth();
}